

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O1

void nni_lmq_flush(nni_lmq *lmq)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  nni_msg *m;
  
  sVar2 = lmq->lmq_len;
  while (sVar2 != 0) {
    sVar3 = lmq->lmq_get;
    uVar1 = sVar3 + 1;
    lmq->lmq_get = uVar1;
    m = lmq->lmq_msgs[sVar3];
    lmq->lmq_get = uVar1 & lmq->lmq_mask;
    lmq->lmq_len = sVar2 - 1;
    nni_msg_free(m);
    sVar2 = lmq->lmq_len;
  }
  return;
}

Assistant:

void
nni_lmq_flush(nni_lmq *lmq)
{
	while (lmq->lmq_len > 0) {
		nng_msg *msg = lmq->lmq_msgs[lmq->lmq_get++];
		lmq->lmq_get &= lmq->lmq_mask;
		lmq->lmq_len--;
		nni_msg_free(msg);
	}
}